

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_bin(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  error_flags eVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  char *unaff_R12;
  char *pcVar9;
  char *pcVar10;
  int iVar11;
  ulong uVar12;
  ulong unaff_R15;
  basic_substring<const_char> bVar13;
  basic_substring<const_char> local_40;
  
  uVar12 = this->len;
  if (pos < uVar12) {
    bVar4 = false;
    do {
      pcVar9 = this->str;
      bVar1 = pcVar9[pos];
      if ((bVar1 & 0xfe) == 0x30) {
        iVar11 = 0;
        bVar4 = true;
        pcVar9 = unaff_R12;
      }
      else if (bVar1 == 0x2e) {
        pos = pos + 1;
        iVar11 = 5;
        pcVar9 = unaff_R12;
      }
      else if ((bVar1 & 0xdf) == 0x50) {
        pos = pos + 1;
        iVar11 = 6;
        pcVar9 = unaff_R12;
      }
      else {
        iVar11 = 1;
        if (((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) ||
             (bVar1 == 0x7d)) || (bVar1 == 0x5d)) && (bVar4)) {
          if (pos != 0xffffffffffffffff && uVar12 < pos) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar2 = (code *)swi(3);
              bVar13 = (basic_substring<const_char>)(*pcVar2)();
              return bVar13;
            }
            handle_error(0x21a325,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x154e,"num <= len || num == npos");
          }
          sVar8 = pos;
          if (pos == 0xffffffffffffffff) {
            sVar8 = this->len;
          }
          basic_substring(&local_40,this->str,sVar8);
          pcVar9 = local_40.str;
          unaff_R15 = local_40.len;
        }
        else {
          unaff_R15 = 0;
        }
      }
      if (iVar11 != 0) {
        if (iVar11 != 5) {
          if (iVar11 != 6) goto LAB_001b9803;
          bVar3 = false;
          goto LAB_001b9830;
        }
        if (pos == 0) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar2 = (code *)swi(3);
            bVar13 = (basic_substring<const_char>)(*pcVar2)();
            return bVar13;
          }
          handle_error(0x21a325,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1999,"pos > 0");
        }
        if (this->str[pos - 1] != '.') {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar2 = (code *)swi(3);
            bVar13 = (basic_substring<const_char>)(*pcVar2)();
            return bVar13;
          }
          handle_error(0x21a325,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x199a,"str[pos - 1] == \'.\'");
        }
        uVar12 = this->len;
        if (uVar12 <= pos) {
          bVar3 = false;
          goto LAB_001b9aa3;
        }
        bVar3 = false;
        pcVar10 = pcVar9;
        goto LAB_001b9978;
      }
      pos = pos + 1;
      uVar12 = this->len;
      unaff_R12 = pcVar9;
    } while (pos < uVar12);
    unaff_R15 = 0;
    if (bVar4) {
      unaff_R15 = uVar12;
    }
  }
  else {
    unaff_R15 = 0;
  }
  pcVar9 = this->str;
  goto LAB_001b9803;
LAB_001b9aa3:
  pcVar9 = this->str;
  unaff_R15 = 0;
  if (bVar4 || bVar3) {
    unaff_R15 = uVar12;
  }
  goto LAB_001b9803;
LAB_001b9978:
  pcVar9 = this->str;
  bVar1 = pcVar9[pos];
  if ((bVar1 & 0xfe) == 0x30) {
    iVar11 = 0;
    bVar3 = true;
    pcVar9 = pcVar10;
  }
  else if ((bVar1 & 0xdf) == 0x50) {
    pos = pos + 1;
    iVar11 = 6;
    pcVar9 = pcVar10;
  }
  else {
    iVar11 = 1;
    uVar7 = (uint)bVar1;
    if (((((uVar7 < 0x3c) && ((0x800120100002601U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) ||
         (uVar7 == 0x7d)) || (uVar7 == 0x5d)) && ((bVar4 || (bVar3)))) {
      if (pos != 0xffffffffffffffff && uVar12 < pos) {
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar2 = (code *)swi(3);
          bVar13 = (basic_substring<const_char>)(*pcVar2)();
          return bVar13;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      sVar8 = pos;
      if (pos == 0xffffffffffffffff) {
        sVar8 = this->len;
      }
      basic_substring(&local_40,this->str,sVar8);
      pcVar9 = local_40.str;
      unaff_R15 = local_40.len;
    }
    else {
      unaff_R15 = 0;
    }
  }
  if (iVar11 == 0) {
    pos = pos + 1;
    uVar12 = this->len;
    pcVar10 = pcVar9;
    if (uVar12 <= pos) goto LAB_001b9aa3;
    goto LAB_001b9978;
  }
  if (iVar11 != 6) goto LAB_001b9803;
LAB_001b9830:
  if (pos == 0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      bVar13 = (basic_substring<const_char>)(*pcVar2)();
      return bVar13;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x19b4,"pos > 0");
  }
  if ((this->str[pos - 1] & 0xdfU) != 0x50) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      bVar13 = (basic_substring<const_char>)(*pcVar2)();
      return bVar13;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x19b5,"str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
  }
  uVar12 = pos + 1;
  if ((uVar12 < this->len) &&
     (((this->str[pos] == '-' || (this->str[pos] == '+')) && ((bool)(bVar4 | bVar3))))) {
    uVar6 = this->len;
    if (uVar12 < uVar6) {
      bVar4 = false;
      do {
        bVar1 = this->str[uVar12];
        bVar3 = true;
        if (9 < (byte)(bVar1 - 0x30)) {
          bVar3 = bVar4;
          if ((bVar4) &&
             (((bVar1 < 0x3c && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) ||
              ((bVar1 == 0x7d || (bVar1 == 0x5d)))))) {
            if (uVar6 < uVar12) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar2 = (code *)swi(3);
                bVar13 = (basic_substring<const_char>)(*pcVar2)();
                return bVar13;
              }
              handle_error(0x21a325,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x154e,"num <= len || num == npos");
            }
            basic_substring(&local_40,this->str,uVar12);
            pcVar9 = local_40.str;
            unaff_R15 = local_40.len;
          }
          else {
            unaff_R15 = 0;
            pcVar9 = this->str;
          }
        }
        bVar4 = bVar3;
        if (9 < (byte)(bVar1 - 0x30)) goto LAB_001b9803;
        uVar12 = uVar12 + 1;
        uVar6 = this->len;
      } while (uVar12 < uVar6);
    }
    pcVar9 = this->str;
    unaff_R15 = uVar6;
  }
  else {
    pcVar9 = this->str;
    unaff_R15 = 0;
  }
LAB_001b9803:
  bVar13.len = unaff_R15;
  bVar13.str = pcVar9;
  return bVar13;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_bin(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c == '0' || c == '1')
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_bin;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_bin;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_bin:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c == '0' || c == '1')
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_bin;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_bin:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }